

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O2

int luaT_callorderiTM(lua_State *L,TValue *p1,int v2,int flip,int isfloat,TMS event)

{
  int iVar1;
  Value *p1_00;
  TValue aux;
  Value local_10;
  byte local_8;
  
  if (isfloat == 0) {
    local_10 = (Value)(long)v2;
  }
  else {
    local_10.n = (lua_Number)v2;
  }
  local_8 = (isfloat != 0) << 4 | 3;
  p1_00 = &local_10;
  if (flip == 0) {
    p1_00 = &p1->value_;
    p1 = (TValue *)&local_10;
  }
  iVar1 = luaT_callorderTM(L,(TValue *)p1_00,p1,event);
  return iVar1;
}

Assistant:

int luaT_callorderiTM (lua_State *L, const TValue *p1, int v2,
                       int flip, int isfloat, TMS event) {
  TValue aux; const TValue *p2;
  if (isfloat) {
    setfltvalue(&aux, cast_num(v2));
  }
  else
    setivalue(&aux, v2);
  if (flip) {  /* arguments were exchanged? */
    p2 = p1; p1 = &aux;  /* correct them */
  }
  else
    p2 = &aux;
  return luaT_callorderTM(L, p1, p2, event);
}